

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FileTree.cpp
# Opt level: O3

PCASC_FILE_NODE __thiscall
CASC_FILE_TREE::PathAt(CASC_FILE_TREE *this,char *szBuffer,size_t cchBuffer,size_t nItemIndex)

{
  LPBYTE pBVar1;
  size_t sVar2;
  PCASC_FILE_NODE pFileNode;
  
  *szBuffer = '\0';
  if (nItemIndex < (this->FileTable).m_ItemCount) {
    pBVar1 = (this->FileTable).m_pItemArray;
    pFileNode = (PCASC_FILE_NODE)(pBVar1 + nItemIndex * (this->FileTable).m_ItemSize);
    if ((pBVar1 != (LPBYTE)0x0) && (pFileNode->NameLength != 0)) {
      sVar2 = MakePath(this,pFileNode,szBuffer,cchBuffer);
      szBuffer[sVar2] = '\0';
    }
    return pFileNode;
  }
  __assert_fail("ItemIndex < m_ItemCount",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Qartar[P]CascLibPlus/lib/CascLib/src/common/../common/Array.h"
                ,0x40,"void *CASC_ARRAY::ItemAt(size_t)");
}

Assistant:

PCASC_FILE_NODE CASC_FILE_TREE::PathAt(char * szBuffer, size_t cchBuffer, size_t nItemIndex)
{
    PCASC_FILE_NODE pFileNode = NULL;
    size_t nLength;

    // Pre-set the buffer with zero
    szBuffer[0] = 0;

    // Query the item
    pFileNode = (PCASC_FILE_NODE)FileTable.ItemAt(nItemIndex);
    if(pFileNode != NULL && pFileNode->NameLength != 0)
    {
        // Construct the full path
        nLength = MakePath(pFileNode, szBuffer, cchBuffer);
        szBuffer[nLength] = 0;
    }
    
    return pFileNode;
}